

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casDec.c
# Opt level: O2

void WriteLUTSintoBLIFfile
               (FILE *pFile,DdManager *dd,LUT **pLuts,int nLuts,DdNode **bCVars,char **pNames,
               int nNames,char *FileName)

{
  LUT *pLVar1;
  char *pcVar2;
  char *pcVar3;
  DdNode *n;
  DdNode *n_00;
  DdNode *n_01;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  char **ppcVar8;
  
  uVar4 = (ulong)(uint)nLuts;
  if (nLuts < 1) {
    uVar4 = 0;
  }
  uVar7 = 0;
  while( true ) {
    if (uVar7 == uVar4) {
      return;
    }
    pLVar1 = pLuts[uVar7];
    if ((uVar7 == nLuts - 1) && (pLVar1->nMulti != 1)) break;
    fprintf((FILE *)pFile,"#----------------- LUT #%d ----------------------\n",uVar7 & 0xffffffff);
    if (uVar7 != 0) {
      for (uVar5 = 0; (long)uVar5 < (long)pLVar1->nInsP; uVar5 = uVar5 + 1) {
        sprintf(WriteLUTSintoBLIFfile::Buffer,"LUT%02d_%02d",(ulong)((int)uVar7 - 1),
                uVar5 & 0xffffffff);
        pcVar2 = Extra_UtilStrsav(WriteLUTSintoBLIFfile::Buffer);
        WriteLUTSintoBLIFfile::pNamesLocalIn[dd->invperm[uVar5]] = pcVar2;
      }
    }
    for (lVar6 = 0; (int)lVar6 < pLVar1->nIns - pLVar1->nInsP; lVar6 = lVar6 + 1) {
      pcVar2 = Extra_UtilStrsav(pNames[dd->invperm[pLVar1->Level + lVar6]]);
      WriteLUTSintoBLIFfile::pNamesLocalIn[dd->invperm[pLVar1->Level + lVar6]] = pcVar2;
    }
    pcVar2 = WriteLUTSintoBLIFfile::Buffer;
    if (uVar7 == nLuts - 1) {
      pcVar2 = "F";
    }
    ppcVar8 = WriteLUTSintoBLIFfile::pNamesLocalOut;
    for (uVar5 = 0; (long)uVar5 < (long)pLVar1->nMulti; uVar5 = uVar5 + 1) {
      sprintf(WriteLUTSintoBLIFfile::Buffer,"LUT%02d_%02d",uVar7,uVar5 & 0xffffffff);
      pcVar3 = Extra_UtilStrsav(pcVar2);
      *ppcVar8 = pcVar3;
      ppcVar8 = ppcVar8 + 1;
    }
    sprintf(WriteLUTSintoBLIFfile::Buffer,"L%02d_",uVar7);
    n = Extra_bddBitsToCube(dd,~(-1 << ((byte)pLVar1->nMulti & 0x1f)),pLVar1->nMulti,bCVars,1);
    Cudd_Ref(n);
    ppcVar8 = WriteLUTSintoBLIFfile::pNamesLocalOut;
    for (uVar5 = 0; (long)uVar5 < (long)pLVar1->nMulti; uVar5 = uVar5 + 1) {
      n_00 = Cudd_Cofactor(dd,pLVar1->bRelation,bCVars[uVar5]);
      Cudd_Ref(n_00);
      n_01 = Cudd_bddExistAbstract(dd,n_00,n);
      Cudd_Ref(n_01);
      Cudd_RecursiveDeref(dd,n_00);
      sprintf(WriteLUTSintoBLIFfile::Buffer,"L%02d_%02d_",uVar7,uVar5 & 0xffffffff);
      WriteDDintoBLIFfile(pFile,n_01,*ppcVar8,WriteLUTSintoBLIFfile::Buffer,
                          WriteLUTSintoBLIFfile::pNamesLocalIn);
      Cudd_RecursiveDeref(dd,n_01);
      ppcVar8 = ppcVar8 + 1;
    }
    Cudd_RecursiveDeref(dd,n);
    ppcVar8 = WriteLUTSintoBLIFfile::pNamesLocalIn;
    for (lVar6 = 0; lVar6 < dd->size; lVar6 = lVar6 + 1) {
      free(*ppcVar8);
      *ppcVar8 = (char *)0x0;
      ppcVar8 = ppcVar8 + 1;
    }
    ppcVar8 = WriteLUTSintoBLIFfile::pNamesLocalOut;
    for (lVar6 = 0; lVar6 < pLVar1->nMulti; lVar6 = lVar6 + 1) {
      if (*ppcVar8 != (char *)0x0) {
        free(*ppcVar8);
        *ppcVar8 = (char *)0x0;
      }
      ppcVar8 = ppcVar8 + 1;
    }
    uVar7 = uVar7 + 1;
  }
  __assert_fail("p->nMulti == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/cas/casDec.c"
                ,0x1b1,
                "void WriteLUTSintoBLIFfile(FILE *, DdManager *, LUT **, int, DdNode **, char **, int, char *)"
               );
}

Assistant:

void WriteLUTSintoBLIFfile( FILE * pFile, DdManager * dd, LUT ** pLuts, int nLuts, DdNode ** bCVars, char ** pNames, int nNames, char * FileName )
{
    int i, v, o;
    static char * pNamesLocalIn[MAXINPUTS];
    static char * pNamesLocalOut[MAXINPUTS];
    static char Buffer[100];
    DdNode * bCube, * bCof, * bFunc;
    LUT * p;

    // go through all the LUTs
    for ( i = 0; i < nLuts; i++ )
    {
        // get the pointer to the LUT
        p = pLuts[i];

        if ( i == nLuts -1 )
        {
            assert( p->nMulti == 1 );
        }


        fprintf( pFile, "#----------------- LUT #%d ----------------------\n", i );


        // fill in the names for the current LUT

        // write the outputs of the previous LUT
        if ( i != 0 )
        for ( v = 0; v < p->nInsP; v++ )
        {
            sprintf( Buffer, "LUT%02d_%02d", i-1, v );
            pNamesLocalIn[dd->invperm[v]] = Extra_UtilStrsav( Buffer );
        }
        // write the primary inputs of the current LUT
        for ( v = 0; v < p->nIns - p->nInsP; v++ )
            pNamesLocalIn[dd->invperm[p->Level+v]] = Extra_UtilStrsav( pNames[dd->invperm[p->Level+v]] );
        // write the outputs of the current LUT
        for ( v = 0; v < p->nMulti; v++ )
        {
            sprintf( Buffer, "LUT%02d_%02d", i, v );
            if ( i != nLuts - 1 )
                pNamesLocalOut[v] = Extra_UtilStrsav( Buffer );
            else 
                pNamesLocalOut[v] = Extra_UtilStrsav( "F" );
        }


        // write LUT outputs

        // get the prefix
        sprintf( Buffer, "L%02d_", i );

        // get the cube of encoding variables
        bCube = Extra_bddBitsToCube( dd, (1<<p->nMulti)-1, p->nMulti, bCVars, 1 );   Cudd_Ref( bCube );

        // write each output of the LUT
        for ( o = 0; o < p->nMulti; o++ )
        {
            // get the cofactor of this output
            bCof = Cudd_Cofactor( dd, p->bRelation, bCVars[o] );  Cudd_Ref( bCof );
            // quantify the remaining variables to get the function
            bFunc = Cudd_bddExistAbstract( dd, bCof, bCube );     Cudd_Ref( bFunc );
            Cudd_RecursiveDeref( dd, bCof );
            
            // write BLIF
            sprintf( Buffer, "L%02d_%02d_", i, o );

//          WriteDDintoBLIFfileReorder( dd, pFile, bFunc, pNamesLocalOut[o], Buffer, pNamesLocalIn );
            // does not work well; the advantage is marginal (30%), the run time is huge...

            WriteDDintoBLIFfile( pFile, bFunc, pNamesLocalOut[o], Buffer, pNamesLocalIn );
            Cudd_RecursiveDeref( dd, bFunc );
        }
        Cudd_RecursiveDeref( dd, bCube );

        // clean up the previous local names
        for ( v = 0; v < dd->size; v++ )
        {
            if ( pNamesLocalIn[v] )
                ABC_FREE( pNamesLocalIn[v] );
            pNamesLocalIn[v] = NULL;
        }
        for ( v = 0; v < p->nMulti; v++ )
            ABC_FREE( pNamesLocalOut[v] );
    }
}